

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O3

aiReturn __thiscall
aiMaterial::AddBinaryProperty
          (aiMaterial *this,void *pInput,uint pSizeInBytes,char *pKey,uint type,uint index,
          aiPropertyTypeInfo pType)

{
  aiMaterialProperty **__src;
  int iVar1;
  aiMaterialProperty *paVar2;
  char *__dest;
  size_t sVar3;
  aiMaterialProperty **__dest_00;
  ulong uVar4;
  uint uVar5;
  uint local_44;
  
  if (pInput == (void *)0x0) {
    __assert_fail("pInput != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Material/MaterialSystem.cpp"
                  ,0x1da,
                  "aiReturn aiMaterial::AddBinaryProperty(const void *, unsigned int, const char *, unsigned int, unsigned int, aiPropertyTypeInfo)"
                 );
  }
  if (pKey == (char *)0x0) {
    __assert_fail("pKey != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Material/MaterialSystem.cpp"
                  ,0x1db,
                  "aiReturn aiMaterial::AddBinaryProperty(const void *, unsigned int, const char *, unsigned int, unsigned int, aiPropertyTypeInfo)"
                 );
  }
  if (pSizeInBytes == 0) {
    __assert_fail("0 != pSizeInBytes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Material/MaterialSystem.cpp"
                  ,0x1dc,
                  "aiReturn aiMaterial::AddBinaryProperty(const void *, unsigned int, const char *, unsigned int, unsigned int, aiPropertyTypeInfo)"
                 );
  }
  uVar5 = this->mNumProperties;
  if (uVar5 == 0) {
    local_44 = 0xffffffff;
    uVar5 = 0;
  }
  else {
    local_44 = 0xffffffff;
    uVar4 = 0;
    do {
      paVar2 = this->mProperties[uVar4];
      if ((((paVar2 != (aiMaterialProperty *)0x0) &&
           (iVar1 = strcmp((paVar2->mKey).data,pKey), iVar1 == 0)) && (paVar2->mSemantic == type))
         && (paVar2->mIndex == index)) {
        if (paVar2->mData != (char *)0x0) {
          operator_delete__(paVar2->mData);
        }
        operator_delete(paVar2,0x420);
        uVar5 = this->mNumProperties;
        local_44 = (uint)uVar4;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar5);
  }
  paVar2 = (aiMaterialProperty *)operator_new(0x420);
  (paVar2->mKey).length = 0;
  (paVar2->mKey).data[0] = '\0';
  memset((paVar2->mKey).data + 1,0x1b,0x3ff);
  paVar2->mData = (char *)0x0;
  paVar2->mType = pType;
  paVar2->mSemantic = type;
  paVar2->mIndex = index;
  paVar2->mDataLength = pSizeInBytes;
  __dest = (char *)operator_new__((ulong)pSizeInBytes);
  paVar2->mData = __dest;
  memcpy(__dest,pInput,(ulong)pSizeInBytes);
  sVar3 = strlen(pKey);
  (paVar2->mKey).length = (ai_uint32)sVar3;
  if ((sVar3 & 0xfffffc00) != 0) {
    __assert_fail("MAXLEN > pcNew->mKey.length",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Material/MaterialSystem.cpp"
                  ,0x1fc,
                  "aiReturn aiMaterial::AddBinaryProperty(const void *, unsigned int, const char *, unsigned int, unsigned int, aiPropertyTypeInfo)"
                 );
  }
  strcpy((paVar2->mKey).data,pKey);
  if (local_44 == 0xffffffff) {
    if (uVar5 == this->mNumAllocated) {
      this->mNumAllocated = uVar5 * 2;
      __dest_00 = (aiMaterialProperty **)operator_new__((ulong)(uVar5 * 2) << 3);
      __src = this->mProperties;
      memcpy(__dest_00,__src,(ulong)uVar5 << 3);
      if (__src != (aiMaterialProperty **)0x0) {
        operator_delete__(__src);
        uVar5 = this->mNumProperties;
      }
      this->mProperties = __dest_00;
    }
    else {
      __dest_00 = this->mProperties;
    }
    this->mNumProperties = uVar5 + 1;
    __dest_00[uVar5] = paVar2;
  }
  else {
    this->mProperties[local_44] = paVar2;
  }
  return aiReturn_SUCCESS;
}

Assistant:

aiReturn aiMaterial::AddBinaryProperty (const void* pInput,
    unsigned int pSizeInBytes,
    const char* pKey,
    unsigned int type,
    unsigned int index,
    aiPropertyTypeInfo pType
    )
{
    ai_assert( pInput != nullptr );
	ai_assert(pKey != nullptr );
    ai_assert( 0 != pSizeInBytes );

    if ( 0 == pSizeInBytes ) {
		return AI_FAILURE;
    }

    // first search the list whether there is already an entry with this key
    unsigned int iOutIndex( UINT_MAX );
    for ( unsigned int i = 0; i < mNumProperties; ++i ) {
        aiMaterialProperty *prop( mProperties[ i ] );

        if (prop /* just for safety */ && !strcmp( prop->mKey.data, pKey ) &&
            prop->mSemantic == type && prop->mIndex == index){

            delete mProperties[i];
            iOutIndex = i;
        }
    }

    // Allocate a new material property
    aiMaterialProperty* pcNew = new aiMaterialProperty();

    // .. and fill it
    pcNew->mType = pType;
    pcNew->mSemantic = type;
    pcNew->mIndex = index;

    pcNew->mDataLength = pSizeInBytes;
    pcNew->mData = new char[pSizeInBytes];
    memcpy (pcNew->mData,pInput,pSizeInBytes);

    pcNew->mKey.length = ::strlen(pKey);
    ai_assert ( MAXLEN > pcNew->mKey.length);
    strcpy( pcNew->mKey.data, pKey );

    if (UINT_MAX != iOutIndex)  {
        mProperties[iOutIndex] = pcNew;
        return AI_SUCCESS;
    }

    // resize the array ... double the storage allocated
    if (mNumProperties == mNumAllocated)    {
        const unsigned int iOld = mNumAllocated;
        mNumAllocated *= 2;

        aiMaterialProperty** ppTemp;
        try {
            ppTemp = new aiMaterialProperty*[mNumAllocated];
        } catch (std::bad_alloc&) {
            delete pcNew;
            return AI_OUTOFMEMORY;
        }

        // just copy all items over; then replace the old array
        memcpy (ppTemp,mProperties,iOld * sizeof(void*));

        delete[] mProperties;
        mProperties = ppTemp;
    }
    // push back ...
    mProperties[mNumProperties++] = pcNew;

    return AI_SUCCESS;
}